

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void CompareOnTheFlyAnimation(comparer_context *comp)

{
  pointer pcVar1;
  string *ctx;
  sliced_chunk_reader reader;
  sliced_chunk_iterator it;
  string local_440;
  undefined1 local_420 [32];
  long local_400;
  
  comparer_context::push_elem(comp,"aiAnimation");
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"mName","");
  comparer_context::cmp<aiString>((aiString *)local_420,comp,&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  pcVar1 = local_420 + 0x10;
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mDuration","");
  comparer_context::cmp<double>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mTicksPerSecond","");
  comparer_context::cmp<double>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mNumChannels","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_);
  }
  ctx = &local_440;
  local_440._M_dataplus._M_p = (pointer)comp;
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_420,(sliced_chunk_reader *)ctx);
  while (local_420[0x10] != '\x01') {
    if (local_420._8_4_ == 0x1238) {
      CompareOnTheFlyNodeAnim(comp);
    }
    sliced_chunk_iterator::cleanup((sliced_chunk_iterator *)local_420,(EVP_PKEY_CTX *)ctx);
    sliced_chunk_iterator::load_next((sliced_chunk_iterator *)local_420);
  }
  fseek(*(FILE **)local_420._0_8_,local_400,0);
  fseek(*(FILE **)(local_420._0_8_ + 8),local_400,0);
  comparer_context::pop_elem(comp);
  return;
}

Assistant:

void CompareOnTheFlyAnimation(comparer_context& comp)   {
    scoped_chunk chunk(comp,"aiAnimation");

    comp.cmp<aiString>("mName");
    comp.cmp<double>("mDuration");
    comp.cmp<double>("mTicksPerSecond");
    comp.cmp<uint32_t>("mNumChannels");

    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AINODEANIM) {
            CompareOnTheFlyNodeAnim(comp);
        }
    }
}